

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedData.c
# Opt level: O1

void ZydisGetElementInfo(ZydisInternalElementType element,ZydisElementType *type,
                        ZydisElementSize *size)

{
  if (element < (ZYDIS_IELEMENT_TYPE_FLOAT16|ZYDIS_IELEMENT_TYPE_INT32)) {
    *type = ZydisGetElementInfo::lookup[element].type;
    *size = ZydisGetElementInfo::lookup[element].size;
    return;
  }
  __assert_fail("element < (sizeof(lookup) / sizeof((lookup)[0]))",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/SharedData.c"
                ,0xa3,
                "void ZydisGetElementInfo(ZydisInternalElementType, ZydisElementType *, ZydisElementSize *)"
               );
}

Assistant:

void ZydisGetElementInfo(ZydisInternalElementType element, ZydisElementType* type,
    ZydisElementSize* size)
{
    static const struct
    {
        ZydisElementType type;
        ZydisElementSize size;
    } lookup[ZYDIS_IELEMENT_TYPE_MAX_VALUE + 1] =
    {
        { ZYDIS_ELEMENT_TYPE_INVALID  ,   0 },
        { ZYDIS_ELEMENT_TYPE_INVALID  ,   0 },
        { ZYDIS_ELEMENT_TYPE_STRUCT   ,   0 },
        { ZYDIS_ELEMENT_TYPE_INT      ,   0 },
        { ZYDIS_ELEMENT_TYPE_UINT     ,   0 },
        { ZYDIS_ELEMENT_TYPE_INT      ,   1 },
        { ZYDIS_ELEMENT_TYPE_INT      ,   8 },
        { ZYDIS_ELEMENT_TYPE_INT      ,  16 },
        { ZYDIS_ELEMENT_TYPE_INT      ,  32 },
        { ZYDIS_ELEMENT_TYPE_INT      ,  64 },
        { ZYDIS_ELEMENT_TYPE_UINT     ,   8 },
        { ZYDIS_ELEMENT_TYPE_UINT     ,  16 },
        { ZYDIS_ELEMENT_TYPE_UINT     ,  32 },
        { ZYDIS_ELEMENT_TYPE_UINT     ,  64 },
        { ZYDIS_ELEMENT_TYPE_UINT     , 128 },
        { ZYDIS_ELEMENT_TYPE_UINT     , 256 },
        { ZYDIS_ELEMENT_TYPE_FLOAT16  ,  16 },
        { ZYDIS_ELEMENT_TYPE_FLOAT16  ,  32 }, // TODO: Should indicate 2 float16 elements
        { ZYDIS_ELEMENT_TYPE_FLOAT32  ,  32 },
        { ZYDIS_ELEMENT_TYPE_FLOAT64  ,  64 },
        { ZYDIS_ELEMENT_TYPE_FLOAT80  ,  80 },
        { ZYDIS_ELEMENT_TYPE_LONGBCD  ,  80 },
        { ZYDIS_ELEMENT_TYPE_CC       ,   3 },
        { ZYDIS_ELEMENT_TYPE_CC       ,   5 }
    };

    ZYAN_ASSERT(element < ZYAN_ARRAY_LENGTH(lookup));

    *type = lookup[element].type;
    *size = lookup[element].size;
}